

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gnutar_filename_encoding.c
# Opt level: O0

void test_gnutar_filename_encoding_EUCJP_CP932(void)

{
  int iVar1;
  char *pcVar2;
  archive_conflict *a_00;
  size_t local_1020;
  size_t used;
  char buff [4096];
  archive_entry *entry;
  archive *a;
  
  pcVar2 = setlocale(6,"ja_JP.eucJP");
  if (pcVar2 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                   ,L'Ŀ');
    test_skipping("eucJP locale not available on this system.");
  }
  else {
    a_00 = (archive_conflict *)archive_write_new();
    iVar1 = archive_write_set_format_gnutar((archive *)a_00);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                        ,L'Ň',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_gnutar(a)",
                        (void *)0x0);
    iVar1 = archive_write_set_options((archive *)a_00,"hdrcharset=CP932");
    if (iVar1 == 0) {
      iVar1 = archive_write_open_memory((archive *)a_00,&used,0x1000,&local_1020);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                          ,L'ŏ',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, sizeof(buff), &used)",(void *)0x0);
      buff._4088_8_ = archive_entry_new2(a_00);
      archive_entry_set_pathname((archive_entry *)buff._4088_8_,anon_var_dwarf_1f8e0 + 0xb);
      archive_entry_set_filetype((archive_entry *)buff._4088_8_,0x8000);
      archive_entry_set_size((archive_entry *)buff._4088_8_,0);
      iVar1 = archive_write_header((archive *)a_00,(archive_entry *)buff._4088_8_);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                          ,L'ŗ',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, entry)",
                          (void *)0x0);
      archive_entry_free((archive_entry *)buff._4088_8_);
      iVar1 = archive_write_free((archive *)a_00);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                          ,L'ř',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                          ,L'Ŝ',&used,"buff",anon_var_dwarf_34513 + 0xb,"\"\\x95\\x5C.txt\"",6,"6",
                          (void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_gnutar_filename_encoding.c"
                     ,L'ŉ');
      test_skipping("This system cannot convert character-set from eucJP to CP932.");
      archive_write_free((archive *)a_00);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_gnutar_filename_encoding_EUCJP_CP932)
{
  	struct archive *a;
  	struct archive_entry *entry;
	char buff[4096];
	size_t used;

	if (NULL == setlocale(LC_ALL, "ja_JP.eucJP")) {
		skipping("eucJP locale not available on this system.");
		return;
	}

	/*
	 * Verify that EUC-JP filenames are correctly translated to CP932.
	 */
	a = archive_write_new();
	assertEqualInt(ARCHIVE_OK, archive_write_set_format_gnutar(a));
	if (archive_write_set_options(a, "hdrcharset=CP932") != ARCHIVE_OK) {
		skipping("This system cannot convert character-set"
		    " from eucJP to CP932.");
		archive_write_free(a);
		return;
	}
	assertEqualInt(ARCHIVE_OK,
	    archive_write_open_memory(a, buff, sizeof(buff), &used));

	entry = archive_entry_new2(a);
	/* Set an EUC-JP filename. */
	archive_entry_set_pathname(entry, "\xC9\xBD.txt");
	/* Check the Unicode version. */
	archive_entry_set_filetype(entry, AE_IFREG);
	archive_entry_set_size(entry, 0);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, entry));
	archive_entry_free(entry);
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Check CP932 version. */
	assertEqualMem(buff, "\x95\x5C.txt", 6);
}